

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Filter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint fFlopsWith;
  uint fFlopsOnly;
  char *pcVar4;
  uint local_3c;
  
  fFlopsOnly = 0;
  Extra_UtilGetoptReset();
  fFlopsWith = 0;
  local_3c = 0;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar2 = Extra_UtilGetopt(argc,argv,"fgivh"), iVar2 == 0x76) {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (0x66 < iVar2) break;
        if (iVar2 == -1) {
          pGia = pAbc->pGia;
          if (pGia == (Gia_Man_t *)0x0) {
            pcVar3 = "Abc_CommandAbc9Srm2(): There is no AIG.\n";
          }
          else {
            if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
              Abc_Print(-1,"Equivalences are not defined.\n");
              return 0;
            }
            if (globalUtilOptind + 2 == argc || globalUtilOptind == argc) {
              if (fFlopsOnly != fFlopsWith) {
                Gia_ManFilterEquivsUsingLatches(pGia,fFlopsOnly,fFlopsWith,local_3c);
              }
              if (globalUtilOptind + 2 != argc) {
                return 0;
              }
              iVar2 = Gia_ManFilterEquivsUsingParts
                                (pAbc->pGia,argv[globalUtilOptind],argv[(long)globalUtilOptind + 1])
              ;
              if (iVar2 != 0) {
                return 0;
              }
              pcVar3 = "Filtering equivalences using PartA and PartB has failed.\n";
            }
            else {
              pcVar3 = "Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n";
            }
          }
          iVar2 = -1;
          goto LAB_002266e6;
        }
        if (iVar2 != 0x66) goto LAB_00226564;
        fFlopsOnly = fFlopsOnly ^ 1;
      }
      if (iVar2 != 0x67) break;
      fFlopsWith = fFlopsWith ^ 1;
    }
    if (iVar2 != 0x69) break;
    local_3c = local_3c ^ 1;
  }
LAB_00226564:
  Abc_Print(-2,"usage: &filter [-fgivh] <PartA_FileName> <PartB_FileName>\n");
  Abc_Print(-2,"\t         performs filtering of equivalence classes\n");
  Abc_Print(-2,"\t         (if Parts A/B are given, removes classes composed of one part)\n");
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fFlopsOnly == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-f     : toggle removing all elements except flops [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fFlopsWith == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-g     : toggle removing classes without flops [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_3c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-i     : toggle using flop inputs instead of flop outputs [default = %s]\n",pcVar3
           );
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar2 = -2;
LAB_002266e6:
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Filter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName1 = NULL, * pFileName2 = NULL;
    int fFlopsOnly = 0, fFlopsWith = 0, fUseRiDrivers = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fgivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFlopsOnly ^= 1;
            break;
        case 'g':
            fFlopsWith ^= 1;
            break;
        case 'i':
            fUseRiDrivers ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pGia->pReprs == NULL || pAbc->pGia->pNexts == NULL )
    {
        Abc_Print( -1, "Equivalences are not defined.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind && argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n" );
        return 1;
    }
    // filter using one of the choices
    if ( fFlopsOnly ^ fFlopsWith )
        Gia_ManFilterEquivsUsingLatches( pAbc->pGia, fFlopsOnly, fFlopsWith, fUseRiDrivers );
    // get the input file name
    if ( argc == globalUtilOptind + 2 )
    {
        pFileName1 = argv[globalUtilOptind];
        pFileName2 = argv[globalUtilOptind+1];
        if ( !Gia_ManFilterEquivsUsingParts( pAbc->pGia, pFileName1, pFileName2 ) )
        {
            Abc_Print( -1, "Filtering equivalences using PartA and PartB has failed.\n" );
            return 1;
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &filter [-fgivh] <PartA_FileName> <PartB_FileName>\n" );
    Abc_Print( -2, "\t         performs filtering of equivalence classes\n" );
    Abc_Print( -2, "\t         (if Parts A/B are given, removes classes composed of one part)\n" );
    Abc_Print( -2, "\t-f     : toggle removing all elements except flops [default = %s]\n", fFlopsOnly? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle removing classes without flops [default = %s]\n", fFlopsWith? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle using flop inputs instead of flop outputs [default = %s]\n", fUseRiDrivers? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}